

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedJoint.cpp
# Opt level: O3

FixedJoint * __thiscall
iDynTree::FixedJoint::getRestTransform(FixedJoint *this,LinkIndex child,LinkIndex parent)

{
  Transform *pTVar1;
  
  pTVar1 = (Transform *)(child + 0x90);
  if (*(long *)(child + 0x20) == parent) {
    pTVar1 = (Transform *)(child + 0x30);
  }
  iDynTree::Transform::Transform((Transform *)this,pTVar1);
  return this;
}

Assistant:

Transform FixedJoint::getRestTransform(const LinkIndex child, const LinkIndex parent) const
{
    if( child == this->link1 )
    {
        return this->link1_X_link2;
    }
    else
    {
        assert(child == this->link2);
        assert(parent == this->link1);
        return this->link2_X_link1;
    }
}